

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

int ecdh_read_public_internal(mbedtls_ecdh_context_mbed *ctx,uchar *buf,size_t blen)

{
  uchar *local_38;
  uchar *p;
  size_t sStack_28;
  int ret;
  size_t blen_local;
  uchar *buf_local;
  mbedtls_ecdh_context_mbed *ctx_local;
  
  p._4_4_ = 0xffffff92;
  local_38 = buf;
  sStack_28 = blen;
  blen_local = (size_t)buf;
  buf_local = (uchar *)ctx;
  ctx_local._4_4_ = mbedtls_ecp_tls_read_point(&ctx->grp,&ctx->Qp,&local_38,blen);
  if (ctx_local._4_4_ == 0) {
    if ((long)local_38 - blen_local == sStack_28) {
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = -0x4f80;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int ecdh_read_public_internal( mbedtls_ecdh_context_mbed *ctx,
                                      const unsigned char *buf, size_t blen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const unsigned char *p = buf;

    if( ( ret = mbedtls_ecp_tls_read_point( &ctx->grp, &ctx->Qp, &p,
                                            blen ) ) != 0 )
        return( ret );

    if( (size_t)( p - buf ) != blen )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    return( 0 );
}